

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void kratos::output_pkg_debug_info
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
                *generator_map,SystemVerilogCodeGenOptions *options)

{
  _Base_ptr p_Var1;
  Generator *pGVar2;
  undefined8 uVar3;
  string *this;
  pointer begin;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  Generator *top;
  type *f_name;
  undefined1 *path2;
  _Base_ptr p_Var7;
  string *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar8 [16];
  string_view format_str;
  format_args args;
  stringstream local_460 [8];
  stringstream json;
  ofstream debug_stream;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8 [14];
  ios_base local_1e0 [264];
  undefined1 local_d8 [8];
  map<unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
  info;
  _Base_ptr local_90;
  string *psStack_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entries;
  size_type *local_50;
  string debug_filename;
  
  uVar3 = _pthread_mutex_unlock;
  pGVar2 = _VTT;
  p_Var4 = (generator_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  info._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&(generator_map->_M_t)._M_impl.super__Rb_tree_header;
  if (p_Var4 != (_Rb_tree_node_base *)info._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    top = _VTT;
    do {
      extract_debug_info_gen_abi_cxx11_
                ((map<unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
                  *)local_d8,*(kratos **)(p_Var4 + 2),top);
      std::__cxx11::stringstream::stringstream(local_460);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&json.field_0x8,"{",1);
      std::ios::widen((char)*(undefined8 *)(json._8_8_ + -0x18) + (char)&json + '\b');
      std::ostream::put((char)&json + '\b');
      std::ostream::flush();
      if (info._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&info) {
        local_90 = (_Base_ptr)0x0;
        p_Var6 = info._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&json.field_0x8,"  \"",3);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&json.field_0x8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\": [",4);
          psStack_78 = (string *)0x0;
          entries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          entries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&psStack_78,
                    ((long)p_Var6[1]._M_left - (long)p_Var6[1]._M_parent >> 3) * -0x3333333333333333
                   );
          p_Var1 = p_Var6[1]._M_left;
          for (p_Var7 = p_Var6[1]._M_parent;
              begin = entries.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, this = psStack_78, p_Var7 != p_Var1
              ; p_Var7 = (_Base_ptr)&p_Var7[1]._M_parent) {
            json._384_4_ = p_Var7->_M_color;
            json._388_4_ = *(undefined4 *)&p_Var7->field_0x4;
            _debug_stream = p_Var7->_M_parent;
            local_2c8[0]._0_8_ = ZEXT48(p_Var7[1]._M_color);
            in_R8 = (string *)&json.field_0x180;
            format_str.size_ = 0x2d;
            format_str.data_ = (char *)0xc;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)in_R8;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_50,(detail *)"[\"{0}\", {1}]",format_str,args);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &psStack_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_50);
            if (local_50 != &debug_filename._M_string_length) {
              operator_delete(local_50,debug_filename._M_string_length + 1);
            }
          }
          local_50 = &debug_filename._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,", ","");
          string::
          join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((string *)&json.field_0x180,this,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )begin,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_50,in_R8);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&json.field_0x8,(char *)json._384_8_,(long)_debug_stream);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)json._384_8_ != local_2c8) {
            operator_delete((void *)json._384_8_,local_2c8[0]._M_allocated_capacity + 1);
          }
          if (local_50 != &debug_filename._M_string_length) {
            operator_delete(local_50,debug_filename._M_string_length + 1);
          }
          local_90 = (_Base_ptr)((long)&local_90->_M_color + 1);
          if (local_90 != info._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&json.field_0x8,",",1);
          }
          std::ios::widen((char)*(undefined8 *)(json._8_8_ + -0x18) + (char)&json + '\b');
          std::ostream::put((char)&json + '\b');
          std::ostream::flush();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&psStack_78);
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != (_Rb_tree_node_base *)&info);
      }
      path2 = &json.field_0x180;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&json.field_0x8,"}",1);
      std::ios::widen((char)*(undefined8 *)(json._8_8_ + -0x18) + (char)&json + '\b');
      std::ostream::put((char)&json + '\b');
      std::ostream::flush();
      json._384_8_ = local_2c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)path2,*(long *)(p_Var4 + 1),
                 (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
      std::__cxx11::string::append(path2);
      fs::join((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
               &options->output_dir,(string *)path2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)json._384_8_ != local_2c8) {
        operator_delete((void *)json._384_8_,local_2c8[0]._M_allocated_capacity + 1);
      }
      std::ofstream::ofstream(&json.field_0x180,(string *)&local_50,_S_trunc|_S_out|_S_in);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&json.field_0x180,(char *)psStack_78,
                 (long)entries.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      if (psStack_78 !=
          (string *)
          &entries.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete(psStack_78,
                        (ulong)((long)&((entries.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      json._384_8_ = pGVar2;
      *(undefined8 *)
       (&json.field_0x180 + pGVar2[-1].stmts_remove_cache_._M_h._M_rehash_policy._M_next_resize) =
           uVar3;
      std::filebuf::~filebuf((filebuf *)&debug_stream);
      std::ios_base::~ios_base(local_1e0);
      if (local_50 != &debug_filename._M_string_length) {
        operator_delete(local_50,debug_filename._M_string_length + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_460);
      std::ios_base::~ios_base((ios_base *)&json.field_0x78);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
                   *)local_d8);
      auVar8 = std::_Rb_tree_increment(p_Var4);
      top = auVar8._8_8_;
      p_Var4 = auVar8._0_8_;
    } while (p_Var4 != (_Rb_tree_node_base *)info._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return;
}

Assistant:

void output_pkg_debug_info(const std::map<std::string, Generator*>& generator_map,
                           const SystemVerilogCodeGenOptions& options) {
    for (const auto& [module_name, module_gen] : generator_map) {
        // use unique since we want to keep it close to where it's declared
        auto info = extract_debug_info_gen(module_gen);
        // a simple JSON writer
        std::stringstream json;
        json << "{" << std::endl;
        uint64_t count = 0;
        for (auto const& [line_num, lines] : info) {
            count++;
            json << "  \"" << line_num << "\": [";
            std::vector<std::string> entries;
            entries.reserve(lines.size());
            for (auto const& [f_name, f_ln] : lines) {
                entries.emplace_back(::format("[\"{0}\", {1}]", f_name, f_ln));
            }
            json << string::join(entries.begin(), entries.end(), ", ") << "]";
            if (count != info.size())
                json << "," << std::endl;
            else
                json << std::endl;
        }
        json << "}" << std::endl;
        // just dump it since we don't care about incremental build for debug info
        auto debug_filename = kratos::fs::join(options.output_dir, module_name + ".sv.debug");
        std::ofstream debug_stream(debug_filename, std::ios::in | std::ios::out | std::ios::trunc);
        debug_stream << json.str();
    }
}